

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_api_v2.c
# Opt level: O1

MPP_RET hal_av1d_deinit(void *hal)

{
  MPP_RET MVar1;
  undefined8 uVar2;
  
  MVar1 = (**(code **)(*hal + 0x20))();
  if (MVar1 < MPP_OK) {
    uVar2 = 0x6b;
  }
  else {
    if (*(MppDev *)((long)hal + 0x48) != (MppDev)0x0) {
      mpp_dev_deinit(*(MppDev *)((long)hal + 0x48));
      *(undefined8 *)((long)hal + 0x48) = 0;
    }
    if (*(MppBufferGroup *)((long)hal + 0x38) == (MppBufferGroup)0x0) {
      return MPP_OK;
    }
    MVar1 = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x38));
    if (MPP_NOK < MVar1) {
      return MPP_OK;
    }
    uVar2 = 0x73;
  }
  if (((byte)hal_av1d_debug & 4) != 0) {
    _mpp_log_l(4,"hal_av1d_api","Function error(%d).\n",(char *)0x0,uVar2);
  }
  return MVar1;
}

Assistant:

MPP_RET hal_av1d_deinit(void *hal)
{
    MPP_RET ret         = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal   = (Av1dHalCtx *)hal;

    FUN_CHECK(ret = p_hal->api->deinit(hal));

    if (p_hal->dev) {
        mpp_dev_deinit(p_hal->dev);
        p_hal->dev = NULL;
    }

    if (p_hal->buf_group) {
        FUN_CHECK(ret = mpp_buffer_group_put(p_hal->buf_group));
    }

    return MPP_OK;
__FAILED:
    return ret;
}